

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

owner * store_ownerbyidx(store_conflict *s,uint idx)

{
  owner *local_28;
  owner *o;
  uint idx_local;
  store_conflict *s_local;
  
  local_28 = s->owners;
  while( true ) {
    if (local_28 == (owner *)0x0) {
      quit_fmt("Bad call to store_ownerbyidx: idx is %d\n",(ulong)idx);
      return (owner *)0x0;
    }
    if (local_28->oidx == idx) break;
    local_28 = local_28->next;
  }
  return local_28;
}

Assistant:

struct owner *store_ownerbyidx(struct store *s, unsigned int idx) {
	struct owner *o;
	for (o = s->owners; o; o = o->next) {
		if (o->oidx == idx)
			return o;
	}

	quit_fmt("Bad call to store_ownerbyidx: idx is %d\n", idx);
	return 0; /* Needed to avoid Windows compiler warning */
}